

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O2

void __thiscall
llvm::DWARFYAML::VisitorImpl<const_llvm::DWARFYAML::Data>::traverseDebugInfo
          (VisitorImpl<const_llvm::DWARFYAML::Data> *this)

{
  uint32_t uVar1;
  Data *pDVar2;
  pointer pUVar3;
  ulong N;
  pointer pEVar4;
  undefined1 uVar5;
  Form FVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  raw_ostream *prVar10;
  pointer pAVar11;
  uint uVar12;
  ulong uVar13;
  char *__assertion;
  const_iterator __begin0;
  long lVar14;
  pointer pEVar15;
  size_t i;
  ulong uVar16;
  pointer pAVar17;
  ulong N_00;
  pointer pUVar18;
  pointer pFVar19;
  pointer pFVar20;
  long lStack_140;
  undefined1 local_118 [8];
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  abbrByteOffsetToDeclsIndex;
  ulong local_38;
  uint64_t offset;
  
  local_118 = (undefined1  [8])&abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize;
  abbrByteOffsetToDeclsIndex._M_h._M_buckets = (__buckets_ptr)0x1;
  abbrByteOffsetToDeclsIndex._M_h._M_bucket_count = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  abbrByteOffsetToDeclsIndex._M_h._M_element_count._0_4_ = 0x3f800000;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._4_4_ = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize = 0;
  lVar14 = 0x28;
  uVar16 = 0;
  while( true ) {
    pDVar2 = this->DebugInfo;
    pAVar11 = (pDVar2->AbbrevDecls).
              super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pDVar2->AbbrevDecls).
                       super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11) / 0x30) <= uVar16
       ) break;
    local_38 = *(ulong *)((long)&(pAVar11->Code).value + lVar14);
    sVar7 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_118,&local_38);
    if (sVar7 == 0) {
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_118,&local_38);
      *pmVar8 = uVar16;
    }
    uVar16 = uVar16 + 1;
    lVar14 = lVar14 + 0x30;
  }
  pUVar18 = (pDVar2->CompileUnits).
            super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (pDVar2->CompileUnits).
           super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl
           .super__Vector_impl_data._M_finish;
  while( true ) {
    if (pUVar18 == pUVar3) {
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_118);
      return;
    }
    uVar16 = (ulong)pUVar18->AbbrOffset;
    local_38 = uVar16;
    sVar7 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_118,&local_38);
    if (sVar7 == 0) break;
    local_38 = uVar16;
    pmVar8 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_118,&local_38);
    N = *pmVar8;
    pAVar11 = (this->DebugInfo->AbbrevDecls).
              super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pAVar11[N].ListOffset != uVar16) {
      __assertion = "DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset";
      uVar12 = 0x58;
      goto LAB_00db0f51;
    }
    uVar9 = ((long)(this->DebugInfo->AbbrevDecls).
                   super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11) / 0x30;
    uVar16 = uVar9;
    if (uVar9 < N) {
      uVar16 = N;
    }
    uVar13 = N;
    for (pAVar11 = pAVar11 + N;
        (N_00 = uVar16, uVar13 < uVar9 && (N_00 = uVar13, (pAVar11->Code).value != 0));
        pAVar11 = pAVar11 + 1) {
      uVar13 = uVar13 + 1;
    }
    if (N != N_00) {
      (*this->_vptr_VisitorImpl[5])(this,pUVar18);
      pEVar15 = (pUVar18->Entries).
                super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar4 = (pUVar18->Entries).
               super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pEVar15 != pEVar4) {
        for (; pEVar15 != pEVar4; pEVar15 = pEVar15 + 1) {
          (*this->_vptr_VisitorImpl[7])(this,pUVar18,pEVar15);
          uVar1 = (pEVar15->AbbrCode).value;
          if (uVar1 != 0) {
            uVar16 = (uVar1 - 1) + N;
            if (uVar16 < N_00) {
              pAVar11 = (this->DebugInfo->AbbrevDecls).
                        super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pFVar19 = (pEVar15->Values).
                        super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pAVar17 = pAVar11[uVar16].Attributes.
                        super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00db0b94:
              if ((pFVar19 !=
                   (pEVar15->Values).
                   super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pAVar17 !=
                  pAVar11[uVar16].Attributes.
                  super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
                (*this->_vptr_VisitorImpl[9])(this,pAVar17,pFVar19);
                FVar6 = pAVar17->Form;
                pFVar20 = pFVar19;
LAB_00db0bbd:
                pFVar19 = pFVar20 + 1;
                switch(FVar6) {
                case DW_FORM_addr:
                  uVar12 = (uint)pUVar18->AddrSize;
LAB_00db0c3a:
                  onVariableSizeValue(this,(pFVar20->Value).value,uVar12);
                case 2:
                case DW_FORM_flag_present:
                case DW_FORM_strx:
                case DW_FORM_addrx:
                case DW_FORM_data16:
                case DW_FORM_implicit_const:
                case DW_FORM_loclistx:
                case DW_FORM_rnglistx:
                case DW_FORM_strx3:
                case DW_FORM_addrx3:
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_block2:
                  (*this->_vptr_VisitorImpl[0xb])
                            (this,(ulong)(*(int *)&(pFVar20->BlockData).
                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                          *(int *)&(pFVar20->BlockData).
                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xffff
                                         ));
                  (*this->_vptr_VisitorImpl[0x10])(this);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_block4:
                  (*this->_vptr_VisitorImpl[0xc])
                            (this,(ulong)(uint)(*(int *)&(pFVar20->BlockData).
                                                                                                                  
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               *(int *)&(pFVar20->BlockData).
                                                                                                                
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
                  (*this->_vptr_VisitorImpl[0x10])(this);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_data2:
                case DW_FORM_ref2:
                case DW_FORM_strx2:
                case DW_FORM_addrx2:
                  (*this->_vptr_VisitorImpl[0xb])(this,(ulong)(ushort)(pFVar20->Value).value);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_data4:
                case DW_FORM_ref4:
                case DW_FORM_ref_sup4:
                case DW_FORM_strx4:
                case DW_FORM_addrx4:
                  (*this->_vptr_VisitorImpl[0xc])(this,(ulong)(uint)(pFVar20->Value).value);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_data8:
                case DW_FORM_ref8:
                case DW_FORM_ref_sig8:
                case DW_FORM_ref_sup8:
                  uVar5 = 0;
                  break;
                case DW_FORM_string:
                  (*this->_vptr_VisitorImpl[0xf])(this,(pFVar20->CStr).Data,(pFVar20->CStr).Length);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_block:
                case DW_FORM_exprloc:
                  (*this->_vptr_VisitorImpl[0xd])
                            (this,(long)(pFVar20->BlockData).
                                        super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pFVar20->BlockData).
                                        super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                        ._M_impl.super__Vector_impl_data._M_start,1);
                  abbrByteOffsetToDeclsIndex._M_h._M_single_bucket =
                       (__node_base_ptr)
                       (pFVar20->BlockData).
                       super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  (*this->_vptr_VisitorImpl[0x10])(this);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_block1:
                  (*this->_vptr_VisitorImpl[10])
                            (this,(ulong)(*(int *)&(pFVar20->BlockData).
                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                          *(int *)&(pFVar20->BlockData).
                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xff))
                  ;
                  (*this->_vptr_VisitorImpl[0x10])(this);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_data1:
                case DW_FORM_flag:
                case DW_FORM_ref1:
                case DW_FORM_strx1:
                case DW_FORM_addrx1:
                  (*this->_vptr_VisitorImpl[10])(this,(ulong)(byte)(pFVar20->Value).value);
                  goto switchD_00db0bda_caseD_2;
                case DW_FORM_sdata:
                  uVar5 = 1;
                  lStack_140 = 0x70;
                  goto LAB_00db0c60;
                case DW_FORM_strp:
                case DW_FORM_sec_offset:
                case DW_FORM_strp_sup:
                case DW_FORM_line_strp:
                  goto switchD_00db0bda_caseD_e;
                case DW_FORM_udata:
                case DW_FORM_ref_udata:
switchD_00db0bda_caseD_f:
                  uVar5 = 1;
                  break;
                case DW_FORM_ref_addr:
                  uVar12 = (uint)((pUVar18->Length).TotalLength == 0xffffffff) * 4 + 4;
                  if (pUVar18->Version == 2) {
                    uVar12 = (uint)pUVar18->AddrSize;
                  }
                  goto LAB_00db0c3a;
                case DW_FORM_indirect:
                  goto switchD_00db0bda_caseD_16;
                default:
                  if (FVar6 - 0x1f01 < 2) goto switchD_00db0bda_caseD_f;
                  if (1 < FVar6 - 0x1f20) goto switchD_00db0bda_caseD_2;
switchD_00db0bda_caseD_e:
                  uVar12 = (uint)((pUVar18->Length).TotalLength == 0xffffffff) * 4 + 4;
                  goto LAB_00db0c3a;
                }
                lStack_140 = 0x68;
LAB_00db0c60:
                (**(code **)((long)this->_vptr_VisitorImpl + lStack_140))
                          (this,(pFVar20->Value).value,uVar5);
                goto switchD_00db0bda_caseD_2;
              }
              (*this->_vptr_VisitorImpl[8])(this,pUVar18,pEVar15);
              goto LAB_00db0ee8;
            }
            prVar10 = errs();
            prVar10 = raw_ostream::operator<<(prVar10,"warning: invalid abbreviation code ");
            prVar10 = raw_ostream::operator<<(prVar10,(ulong)(pEVar15->AbbrCode).value);
            prVar10 = raw_ostream::operator<<(prVar10," (range: ");
            prVar10 = raw_ostream::operator<<(prVar10,N);
            prVar10 = raw_ostream::operator<<(prVar10,"..");
            prVar10 = raw_ostream::operator<<(prVar10,N_00);
            raw_ostream::operator<<(prVar10,")\n");
          }
LAB_00db0ee8:
        }
        (*this->_vptr_VisitorImpl[6])(this,pUVar18);
      }
    }
    pUVar18 = pUVar18 + 1;
  }
  __assertion = "abbrByteOffsetToDeclsIndex.count(offset)";
  uVar12 = 0x56;
LAB_00db0f51:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                ,uVar12,
                "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
               );
switchD_00db0bda_caseD_16:
  (*this->_vptr_VisitorImpl[0xd])(this,(pFVar20->Value).value,1);
  FVar6 = (Form)(pFVar20->Value).value;
  pFVar20 = pFVar19;
  goto LAB_00db0bbd;
switchD_00db0bda_caseD_2:
  pAVar17 = pAVar17 + 1;
  goto LAB_00db0b94;
}

Assistant:

void DWARFYAML::VisitorImpl<T>::traverseDebugInfo() {
  // XXX BINARYEN: Handle multiple linked compile units, each of which can
  // refer to a different abbreviation list.
  // TODO: This code appears to assume that abbreviation codes increment by 1
  // so that lookups are linear. In LLVM output that is true, but it might not
  // be in general.
  // Create a map of [byte offset into the abbreviation section] => [index in
  // DebugInfo.AbbrevDecls]. This avoids linear search for each CU.
  std::unordered_map<size_t, size_t> abbrByteOffsetToDeclsIndex;
  for (size_t i = 0; i < DebugInfo.AbbrevDecls.size(); i++) {
    auto offset = DebugInfo.AbbrevDecls[i].ListOffset;
    // The offset is the same for all entries for the same CU, so only note the
    // first as that is where the list for the CU (that LLVM DeclSet) begins.
    // That is, DebugInfo.AbbrevDecls looks like this:
    //
    //  i  CU   Abbrev  ListOffset
    // ============================
    //  0   X     X1      150
    //  1   X     X2      150
    //  2   X     X3      150
    //           ..
    //  6   Y     Y1      260
    //  7   Y     Y2      260
    //
    // Note how multiple rows i have the same CU. All those abbrevs have the
    // same ListOffset, which is the byte offset into the abbreviation section
    // for that set of abbreviations.
    if (abbrByteOffsetToDeclsIndex.count(offset)) {
      continue;
    }
    abbrByteOffsetToDeclsIndex[offset] = i;
  }
  for (auto &Unit : DebugInfo.CompileUnits) {
    // AbbrOffset is the byte offset into the abbreviation section, which we
    // need to find among the Abbrev's ListOffsets (which are the byte offsets
    // of where that abbreviation list begins).
    // TODO: Optimize this to not be O(#CUs * #abbrevs).
    auto offset = Unit.AbbrOffset;
    assert(abbrByteOffsetToDeclsIndex.count(offset));
    size_t AbbrevStart = abbrByteOffsetToDeclsIndex[offset];
    assert(DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset);
    // Find the last entry in this abbreviation list.
    size_t AbbrevEnd = AbbrevStart;
    while (AbbrevEnd < DebugInfo.AbbrevDecls.size() &&
           DebugInfo.AbbrevDecls[AbbrevEnd].Code) {
      AbbrevEnd++;
    }
    // XXX BINARYEN If there are no abbreviations, there is nothing to
    //              do in this unit.
    if (AbbrevStart == AbbrevEnd) {
      continue;
    }
    onStartCompileUnit(Unit);
    if (Unit.Entries.empty()) { // XXX BINARYEN
      continue;
    }
    for (auto &Entry : Unit.Entries) {
      onStartDIE(Unit, Entry);
      if (Entry.AbbrCode == 0u)
        continue;
      // XXX BINARYEN valid abbreviation codes start from 1, so subtract that,
      //              and are relative to the start of the abbrev table
      auto RelativeAbbrIndex = Entry.AbbrCode - 1 + AbbrevStart;
      if (RelativeAbbrIndex >= AbbrevEnd) {
        errs() << "warning: invalid abbreviation code " << Entry.AbbrCode
               << " (range: " << AbbrevStart << ".." << AbbrevEnd << ")\n";
        continue;
      }
      auto &Abbrev = DebugInfo.AbbrevDecls[RelativeAbbrIndex];
      auto FormVal = Entry.Values.begin();
      auto AbbrForm = Abbrev.Attributes.begin();
      for (;
           FormVal != Entry.Values.end() && AbbrForm != Abbrev.Attributes.end();
           ++FormVal, ++AbbrForm) {
        onForm(*AbbrForm, *FormVal);
        dwarf::Form Form = AbbrForm->Form;
        bool Indirect;
        do {
          Indirect = false;
          switch (Form) {
          case dwarf::DW_FORM_addr:
            onVariableSizeValue(FormVal->Value, Unit.AddrSize);
            break;
          case dwarf::DW_FORM_ref_addr:
            onVariableSizeValue(FormVal->Value, getRefSize(Unit));
            break;
          case dwarf::DW_FORM_exprloc:
          case dwarf::DW_FORM_block:
            onValue((uint64_t)FormVal->BlockData.size(), true);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          case dwarf::DW_FORM_block1: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint8_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block2: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint16_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block4: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint32_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_data1:
          case dwarf::DW_FORM_ref1:
          case dwarf::DW_FORM_flag:
          case dwarf::DW_FORM_strx1:
          case dwarf::DW_FORM_addrx1:
            onValue((uint8_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data2:
          case dwarf::DW_FORM_ref2:
          case dwarf::DW_FORM_strx2:
          case dwarf::DW_FORM_addrx2:
            onValue((uint16_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data4:
          case dwarf::DW_FORM_ref4:
          case dwarf::DW_FORM_ref_sup4:
          case dwarf::DW_FORM_strx4:
          case dwarf::DW_FORM_addrx4:
            onValue((uint32_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data8:
          case dwarf::DW_FORM_ref8:
          case dwarf::DW_FORM_ref_sup8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_sdata:
            onValue((int64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_udata:
          case dwarf::DW_FORM_ref_udata:
            onValue((uint64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_string:
            onValue(FormVal->CStr);
            break;
          case dwarf::DW_FORM_indirect:
            onValue((uint64_t)FormVal->Value, true);
            Indirect = true;
            Form = static_cast<dwarf::Form>((uint64_t)FormVal->Value);
            ++FormVal;
            break;
          case dwarf::DW_FORM_strp:
          case dwarf::DW_FORM_sec_offset:
          case dwarf::DW_FORM_GNU_ref_alt:
          case dwarf::DW_FORM_GNU_strp_alt:
          case dwarf::DW_FORM_line_strp:
          case dwarf::DW_FORM_strp_sup:
            onVariableSizeValue(FormVal->Value, getOffsetSize(Unit));
            break;
          case dwarf::DW_FORM_ref_sig8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_GNU_addr_index:
          case dwarf::DW_FORM_GNU_str_index:
            onValue((uint64_t)FormVal->Value, true);
            break;
          default:
            break;
          }
        } while (Indirect);
      }
      onEndDIE(Unit, Entry);
    }
    onEndCompileUnit(Unit);
  }
}